

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astDownCastNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t tuple;
  undefined1 local_88 [8];
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_16_2_51306afc gcFrame;
  sysbvm_astCoerceValueNode_t **coerceValueNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  memset(&gcFrameRecord.roots,0,0x10);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  local_88 = (undefined1  [8])0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_88);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)
       sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                 (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)
       sysbvm_type_coerceValue
                 (context,(context->roots).typeType,(sysbvm_tuple_t)gcFrameRecord.roots);
  tuple = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                    (context,*(sysbvm_tuple_t *)(*arguments + 0x30),arguments[1]);
  _Var1 = sysbvm_tuple_isKindOf(context,tuple,(sysbvm_tuple_t)gcFrameRecord.roots);
  if (!_Var1) {
    sysbvm_error("Downcast failure.");
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_88);
  return tuple;
}

Assistant:

static sysbvm_tuple_t sysbvm_astDownCastNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astCoerceValueNode_t **coerceValueNode = (sysbvm_astCoerceValueNode_t**)node;
    struct {
        sysbvm_tuple_t type;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*coerceValueNode)->super.sourcePosition);

    gcFrame.type = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*coerceValueNode)->typeExpression, *environment);
    gcFrame.type = sysbvm_type_coerceValue(context, context->roots.typeType, gcFrame.type);

    gcFrame.result = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*coerceValueNode)->valueExpression, *environment);
    if(!sysbvm_tuple_isKindOf(context, gcFrame.result, gcFrame.type))
        sysbvm_error("Downcast failure.");

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    return gcFrame.result;
}